

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::AggressiveDCEPass::MarkLoopConstructAsLiveIfLoopHeader
          (AggressiveDCEPass *this,BasicBlock *basic_block)

{
  Instruction *inst;
  Instruction *inst_00;
  Instruction *merge_inst;
  BasicBlock *basic_block_local;
  AggressiveDCEPass *this_local;
  
  inst = BasicBlock::GetLoopMergeInst(basic_block);
  if (inst != (Instruction *)0x0) {
    inst_00 = BasicBlock::terminator(basic_block);
    AddToWorklist(this,inst_00);
    AddToWorklist(this,inst);
  }
  return;
}

Assistant:

void AggressiveDCEPass::MarkLoopConstructAsLiveIfLoopHeader(
    BasicBlock* basic_block) {
  // If this is the header for a loop, then loop structure needs to keep as well
  // because the loop header is also part of the loop.
  Instruction* merge_inst = basic_block->GetLoopMergeInst();
  if (merge_inst != nullptr) {
    AddToWorklist(basic_block->terminator());
    AddToWorklist(merge_inst);
  }
}